

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder.c
# Opt level: O1

lzma_ret lzma_block_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_block *block)

{
  lzma_bool lVar1;
  lzma_ret lVar2;
  lzma_next_coder *next_00;
  
  if ((code *)next->init != lzma_block_encoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)lzma_block_encoder_init;
  lVar2 = LZMA_PROG_ERROR;
  if ((block != (lzma_block *)0x0) && (lVar2 = LZMA_OPTIONS_ERROR, block->version < 2)) {
    lVar2 = LZMA_PROG_ERROR;
    if (block->check < 0x10) {
      lVar1 = lzma_check_is_supported(block->check);
      if (lVar1 != '\0') {
        next_00 = (lzma_next_coder *)next->coder;
        if (next_00 == (lzma_next_coder *)0x0) {
          next_00 = (lzma_next_coder *)lzma_alloc(0xd8,allocator);
          if (next_00 == (lzma_next_coder *)0x0) {
            return LZMA_MEM_ERROR;
          }
          next->coder = next_00;
          next->code = block_encode;
          next->end = block_encoder_end;
          next->update = block_encoder_update;
          next_00->coder = (void *)0x0;
          next_00->id = 0xffffffffffffffff;
          next_00->init = 0;
          next_00->code = (lzma_code_function)0x0;
          next_00->end = (lzma_end_function)0x0;
          next_00->get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
          next_00->get_check = (_func_lzma_check_void_ptr *)0x0;
          next_00->memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
          next_00->update =
               (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
        }
        *(undefined4 *)&next_00[1].id = 0;
        next_00[1].coder = block;
        next_00[1].init = 0;
        next_00[1].code = (lzma_code_function)0x0;
        next_00[1].end = (lzma_end_function)0x0;
        lzma_check_init((lzma_check_state *)&next_00[1].get_progress,block->check);
        lVar2 = lzma_raw_encoder_init(next_00,allocator,block->filters);
        return lVar2;
      }
      lVar2 = LZMA_UNSUPPORTED_CHECK;
    }
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_block_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_encoder_init, next, allocator);

	if (block == NULL)
		return LZMA_PROG_ERROR;

	// The contents of the structure may depend on the version so
	// check the version first.
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	// If the Check ID is not supported, we cannot calculate the check and
	// thus not create a proper Block.
	if ((unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(block->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Allocate and initialize *next->coder if needed.
	lzma_block_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_block_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &block_encode;
		next->end = &block_encoder_end;
		next->update = &block_encoder_update;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	coder->sequence = SEQ_CODE;
	coder->block = block;
	coder->compressed_size = 0;
	coder->uncompressed_size = 0;
	coder->pos = 0;

	// Initialize the check
	lzma_check_init(&coder->check, block->check);

	// Initialize the requested filters.
	return lzma_raw_encoder_init(&coder->next, allocator, block->filters);
}